

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_Digests(archive_read *a,_7z_digests *d,size_t num)

{
  int iVar1;
  uint32_t uVar2;
  uchar *puVar3;
  uint32_t *puVar4;
  uint local_34;
  uint i;
  uchar *p;
  size_t num_local;
  _7z_digests *d_local;
  archive_read *a_local;
  
  if (num == 0) {
    a_local._4_4_ = -1;
  }
  else {
    memset(d,0,0x10);
    puVar3 = (uchar *)malloc(num);
    d->defineds = puVar3;
    if (d->defineds == (uchar *)0x0) {
      a_local._4_4_ = -1;
    }
    else {
      puVar3 = header_bytes(a,1);
      if (puVar3 == (uchar *)0x0) {
        a_local._4_4_ = -1;
      }
      else {
        if (*puVar3 == '\0') {
          iVar1 = read_Bools(a,d->defineds,num);
          if (iVar1 < 0) {
            return -1;
          }
        }
        else {
          memset(d->defineds,1,num);
        }
        puVar4 = (uint32_t *)calloc(num,4);
        d->digests = puVar4;
        if (d->digests == (uint32_t *)0x0) {
          a_local._4_4_ = -1;
        }
        else {
          for (local_34 = 0; local_34 < num; local_34 = local_34 + 1) {
            if (d->defineds[local_34] != '\0') {
              puVar3 = header_bytes(a,4);
              if (puVar3 == (uchar *)0x0) {
                return -1;
              }
              uVar2 = archive_le32dec(puVar3);
              d->digests[local_34] = uVar2;
            }
          }
          a_local._4_4_ = 0;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_Digests(struct archive_read *a, struct _7z_digests *d, size_t num)
{
	const unsigned char *p;
	unsigned i;

	if (num == 0)
		return (-1);
	memset(d, 0, sizeof(*d));

	d->defineds = malloc(num);
	if (d->defineds == NULL)
		return (-1);
	/*
	 * Read Bools.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == 0) {
		if (read_Bools(a, d->defineds, num) < 0)
			return (-1);
	} else
		/* All are defined */
		memset(d->defineds, 1, num);

	d->digests = calloc(num, sizeof(*d->digests));
	if (d->digests == NULL)
		return (-1);
	for (i = 0; i < num; i++) {
		if (d->defineds[i]) {
			if ((p = header_bytes(a, 4)) == NULL)
				return (-1);
			d->digests[i] = archive_le32dec(p);
		}
	}

	return (0);
}